

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# luac.c
# Opt level: O3

int pmain(lua_State *L)

{
  char cVar1;
  byte bVar2;
  uint uVar3;
  long lVar4;
  long lVar5;
  uint uVar6;
  int iVar7;
  uint uVar8;
  uint uVar9;
  int iVar10;
  int extraout_EAX;
  lua_Integer lVar11;
  void *pvVar12;
  FILE *__stream;
  Proto **ppPVar13;
  char *pcVar14;
  int iVar15;
  char *pcVar16;
  uint full;
  Proto *pPVar17;
  Proto *pPVar18;
  char *pcVar19;
  ulong uVar20;
  char *pcVar21;
  char *pcVar22;
  char *pcVar23;
  uint uVar24;
  long lVar25;
  ulong uVar26;
  uint uVar27;
  uint uVar28;
  uint local_2c;
  
  lVar11 = lua_tointegerx(L,1,(int *)0x0);
  pvVar12 = lua_touserdata(L,2);
  uVar27 = (uint)lVar11;
  full = uVar27;
  iVar7 = lua_checkstack(L,uVar27);
  if (iVar7 == 0) {
LAB_00104947:
    pmain_cold_3();
LAB_0010494c:
    pmain_cold_2();
LAB_00104954:
    cannot("open");
  }
  else {
    if ((int)uVar27 < 1) {
LAB_0010481e:
      full = 0x1050d3;
      local_2c = uVar27;
      iVar7 = lua_load(L,reader,&local_2c,"=(luac)",(char *)0x0);
      if (iVar7 != 0) goto LAB_0010494c;
      pPVar18 = *(Proto **)(L->top[-1].value_.f + 0x18);
      if (0 < (int)uVar27) {
        ppPVar13 = pPVar18->p;
        lVar25 = (long)(int)~uVar27 << 4;
        uVar26 = 0;
        do {
          ppPVar13[uVar26] = *(Proto **)(*(long *)((long)&L->top->value_ + lVar25) + 0x18);
          ppPVar13 = pPVar18->p;
          pPVar17 = ppPVar13[uVar26];
          if (0 < pPVar17->sizeupvalues) {
            pPVar17 = (Proto *)pPVar17->upvalues;
            pPVar17->tt = '\0';
          }
          full = (uint)pPVar17;
          uVar26 = uVar26 + 1;
          lVar25 = lVar25 + 0x10;
        } while ((uVar27 & 0x7fffffff) != uVar26);
      }
      pPVar18->sizelineinfo = 0;
    }
    else {
      uVar26 = 0;
      do {
        pcVar14 = *(char **)((long)pvVar12 + uVar26 * 8);
        if ((*pcVar14 == '-') && (pcVar14[1] == '\0')) {
          pcVar14 = (char *)0x0;
        }
        iVar7 = luaL_loadfilex(L,pcVar14,(char *)0x0);
        full = (uint)pcVar14;
        if (iVar7 != 0) {
          pmain_cold_1();
          goto LAB_00104947;
        }
        uVar26 = uVar26 + 1;
      } while ((uVar27 & 0x7fffffff) != uVar26);
      if (uVar27 != 1) goto LAB_0010481e;
      pPVar18 = *(Proto **)(L->top[-1].value_.f + 0x18);
    }
    if (listing != 0) {
      full = (uint)(1 < listing);
      PrintFunction(pPVar18,(uint)(1 < listing));
    }
    if (dumping != '\0') {
      return 0;
    }
    __stream = _stdout;
    if (output != (char *)0x0) {
      full = 0x11932f;
      __stream = fopen64(output,"wb");
    }
    if (__stream == (FILE *)0x0) goto LAB_00104954;
    luaU_dump(L,pPVar18,writer,__stream,(uint)stripping);
    full = (uint)pPVar18;
    iVar7 = ferror(__stream);
    if (iVar7 == 0) {
      iVar7 = fclose(__stream);
      if (iVar7 == 0) {
        return 0;
      }
      goto LAB_0010496c;
    }
  }
  cannot("write");
LAB_0010496c:
  pcVar21 = "close";
  cannot("close");
  pcVar14 = "=?";
  if (*(long *)(pcVar21 + 0x68) != 0) {
    pcVar14 = (char *)(*(long *)(pcVar21 + 0x68) + 0x18);
  }
  cVar1 = *pcVar14;
  if (cVar1 == '\x1b') {
    pcVar14 = "(bstring)";
  }
  else if ((cVar1 == '@') || (cVar1 == '=')) {
    pcVar14 = pcVar14 + 1;
  }
  else {
    pcVar14 = "(string)";
  }
  uVar27 = *(uint *)(pcVar21 + 0x20);
  pcVar19 = "function";
  if (*(uint *)(pcVar21 + 0x28) == 0) {
    pcVar19 = "main";
  }
  pcVar16 = "s";
  pcVar22 = "s";
  if (*(uint *)(pcVar21 + 0x18) == 1) {
    pcVar22 = "";
  }
  printf("\n%s <%s:%d,%d> (%d instruction%s at %p)\n",pcVar19,pcVar14,
         (ulong)*(uint *)(pcVar21 + 0x28),(ulong)*(uint *)(pcVar21 + 0x2c),
         (ulong)*(uint *)(pcVar21 + 0x18),pcVar22,pcVar21);
  pcVar14 = "+";
  if (pcVar21[0xb] == '\0') {
    pcVar14 = "";
  }
  pcVar19 = "s";
  if (pcVar21[10] == 1) {
    pcVar19 = "";
  }
  pcVar22 = "s";
  if (pcVar21[0xc] == 1) {
    pcVar22 = "";
  }
  pcVar23 = "s";
  if (*(uint *)(pcVar21 + 0x10) == 1) {
    pcVar23 = "";
  }
  printf("%d%s param%s, %d slot%s, %d upvalue%s, ",(ulong)(byte)pcVar21[10],pcVar14,pcVar19,
         (ulong)(byte)pcVar21[0xc],pcVar22,(ulong)*(uint *)(pcVar21 + 0x10),pcVar23);
  pcVar14 = "s";
  if (*(uint *)(pcVar21 + 0x24) == 1) {
    pcVar14 = "";
  }
  pcVar19 = "s";
  if (*(uint *)(pcVar21 + 0x14) == 1) {
    pcVar19 = "";
  }
  if (*(uint *)(pcVar21 + 0x20) == 1) {
    pcVar16 = "";
  }
  printf("%d local%s, %d constant%s, %d function%s\n",(ulong)*(uint *)(pcVar21 + 0x24),pcVar14,
         (ulong)*(uint *)(pcVar21 + 0x14),pcVar19,(ulong)*(uint *)(pcVar21 + 0x20),pcVar16,pcVar23);
  iVar7 = *(int *)(pcVar21 + 0x18);
  iVar10 = iVar7;
  if (0 < iVar7) {
    lVar25 = *(long *)(pcVar21 + 0x38);
    iVar15 = 0;
    do {
      uVar3 = *(uint *)(lVar25 + (long)iVar15 * 4);
      if (*(long *)(pcVar21 + 0x48) == 0) {
        printf("\t%d\t",(ulong)(iVar15 + 1));
LAB_00104b2d:
        printf("[-]\t");
      }
      else {
        uVar9 = *(uint *)(*(long *)(pcVar21 + 0x48) + (long)iVar15 * 4);
        printf("\t%d\t",(ulong)(iVar15 + 1));
        if ((int)uVar9 < 1) goto LAB_00104b2d;
        printf("[%d]\t",(ulong)uVar9);
      }
      uVar24 = uVar3 & 0x3f;
      uVar28 = uVar3 >> 6;
      uVar26 = (ulong)uVar28 & 0xff;
      uVar8 = uVar3 >> 0x17;
      uVar9 = uVar3 >> 0xe;
      printf("%-9s\t",luaP_opnames[uVar24]);
      bVar2 = luaP_opmodes[uVar24];
      switch(bVar2 & 3) {
      case 0:
        printf("%d",uVar26);
        if ((bVar2 & 0x30) != 0) {
          uVar6 = ~uVar8 | 0xffffff00;
          if (-1 < (int)uVar3) {
            uVar6 = uVar8;
          }
          printf(" %d",(ulong)uVar6);
        }
        if ((bVar2 & 0xc) != 0) {
          uVar6 = ~uVar9 | 0xffffff00;
          if ((uVar3 >> 0x16 & 1) == 0) {
            uVar6 = uVar9 & 0x1ff;
          }
LAB_00104c6f:
          printf(" %d",(ulong)uVar6);
        }
        break;
      case 1:
        printf("%d",uVar26);
        if ((bVar2 & 0x30) == 0x10) {
          pcVar14 = " %d";
          uVar20 = (ulong)uVar9;
          goto LAB_00104c8b;
        }
        if ((bVar2 & 0x30) == 0x30) {
          uVar6 = ~uVar9;
          goto LAB_00104c6f;
        }
        break;
      case 2:
        printf("%d %d",uVar26,(ulong)(uVar9 - 0x1ffff));
        break;
      case 3:
        pcVar14 = "%d";
        uVar20 = (ulong)~uVar28;
LAB_00104c8b:
        printf(pcVar14,uVar20);
      }
      switch(uVar24) {
      case 1:
        printf("\t; ");
        pPVar18 = *(Proto **)(pcVar21 + 0x30);
        goto LAB_00104eb8;
      case 5:
      case 9:
        lVar4 = *(long *)(*(long *)(pcVar21 + 0x58) + (ulong)(uVar8 << 4));
        pcVar14 = "-";
        if (lVar4 != 0) {
          pcVar14 = (char *)(lVar4 + 0x18);
        }
        pcVar19 = "\t; %s";
        goto LAB_00104d98;
      case 6:
        lVar4 = *(long *)(*(long *)(pcVar21 + 0x58) + (ulong)(uVar8 << 4));
        pcVar14 = "-";
        if (lVar4 != 0) {
          pcVar14 = (char *)(lVar4 + 0x18);
        }
        printf("\t; %s",pcVar14);
        if ((uVar3 >> 0x16 & 1) != 0) {
          putchar(0x20);
LAB_00104eaf:
          uVar9 = uVar9 & 0xff;
          pPVar18 = *(Proto **)(pcVar21 + 0x30);
          goto LAB_00104eb8;
        }
        break;
      case 7:
      case 0xc:
        if ((uVar3 >> 0x16 & 1) != 0) {
          printf("\t; ");
          goto LAB_00104eaf;
        }
        break;
      case 8:
        lVar4 = *(long *)(*(long *)(pcVar21 + 0x58) + (ulong)(uint)((int)uVar26 << 4));
        pcVar14 = "-";
        if (lVar4 != 0) {
          pcVar14 = (char *)(lVar4 + 0x18);
        }
        printf("\t; %s",pcVar14);
        if ((int)uVar3 < 0) {
          putchar(0x20);
          PrintConstant(*(Proto **)(pcVar21 + 0x30),uVar8 & 0xff);
        }
        if ((uVar3 >> 0x16 & 1) != 0) {
          putchar(0x20);
LAB_00104e5d:
          PrintConstant(*(Proto **)(pcVar21 + 0x30),uVar9 & 0xff);
        }
        goto LAB_00104ec2;
      case 10:
      case 0xd:
      case 0xe:
      case 0xf:
      case 0x11:
      case 0x12:
      case 0x13:
      case 0x14:
      case 0x15:
      case 0x16:
      case 0x17:
      case 0x18:
      case 0x1f:
      case 0x20:
      case 0x21:
        if ((uVar3 & 0x80400000) == 0) break;
        printf("\t; ");
        if ((int)uVar3 < 0) {
          PrintConstant(*(Proto **)(pcVar21 + 0x30),uVar8 & 0xff);
        }
        else {
          putchar(0x2d);
        }
        putchar(0x20);
        if ((uVar3 >> 0x16 & 1) != 0) goto LAB_00104e5d;
        putchar(0x2d);
        goto LAB_00104ec2;
      case 0x1e:
      case 0x27:
      case 0x28:
      case 0x2a:
        printf("\t; to %d",(ulong)(iVar15 + (uVar9 - 0x1ffff) + 2));
        goto LAB_00104ec2;
      case 0x2b:
        if ((uVar9 & 0x1ff) != 0) {
          printf("\t; %d");
          break;
        }
        printf("\t; %d",(ulong)*(uint *)(lVar25 + (long)(iVar15 + 1) * 4));
        iVar15 = iVar15 + 1;
        goto LAB_00104ec2;
      case 0x2c:
        pcVar14 = *(char **)(*(long *)(pcVar21 + 0x40) + (ulong)uVar9 * 8);
        pcVar19 = "\t; %p";
LAB_00104d98:
        printf(pcVar19,pcVar14);
        break;
      case 0x2e:
        printf("\t; ");
        pPVar18 = *(Proto **)(pcVar21 + 0x30);
        uVar9 = uVar28;
LAB_00104eb8:
        PrintConstant(pPVar18,uVar9);
      }
LAB_00104ec2:
      iVar10 = putchar(10);
      iVar15 = iVar15 + 1;
    } while (iVar15 < iVar7);
  }
  if (full != 0) {
    uVar3 = *(uint *)(pcVar21 + 0x14);
    printf("constants (%d) for %p:\n",(ulong)uVar3,pcVar21);
    if (0 < (int)uVar3) {
      uVar9 = 0;
      do {
        uVar8 = uVar9 + 1;
        printf("\t%d\t",(ulong)uVar8);
        PrintConstant(*(Proto **)(pcVar21 + 0x30),uVar9);
        putchar(10);
        uVar9 = uVar8;
      } while (uVar3 != uVar8);
    }
    uVar3 = *(uint *)(pcVar21 + 0x24);
    printf("locals (%d) for %p:\n",(ulong)uVar3,pcVar21);
    if (0 < (long)(int)uVar3) {
      lVar25 = 0xc;
      uVar26 = 0;
      do {
        lVar4 = *(long *)(pcVar21 + 0x50);
        printf("\t%d\t%s\t%d\t%d\n",uVar26 & 0xffffffff,*(long *)(lVar4 + -0xc + lVar25) + 0x18,
               (ulong)(*(int *)(lVar4 + -4 + lVar25) + 1),(ulong)(*(int *)(lVar4 + lVar25) + 1));
        uVar26 = uVar26 + 1;
        lVar25 = lVar25 + 0x10;
      } while ((long)(int)uVar3 != uVar26);
    }
    uVar3 = *(uint *)(pcVar21 + 0x10);
    iVar10 = printf("upvalues (%d) for %p:\n",(ulong)uVar3,pcVar21);
    if (0 < (long)(int)uVar3) {
      lVar25 = 9;
      uVar26 = 0;
      do {
        lVar4 = *(long *)(pcVar21 + 0x58);
        lVar5 = *(long *)(lVar4 + -9 + lVar25);
        pcVar14 = (char *)(lVar5 + 0x18);
        if (lVar5 == 0) {
          pcVar14 = "-";
        }
        iVar10 = printf("\t%d\t%s\t%d\t%d\n",uVar26 & 0xffffffff,pcVar14,
                        (ulong)*(byte *)(lVar4 + -1 + lVar25),(ulong)*(byte *)(lVar4 + lVar25));
        uVar26 = uVar26 + 1;
        lVar25 = lVar25 + 0x10;
      } while ((long)(int)uVar3 != uVar26);
    }
  }
  if (0 < (int)uVar27) {
    uVar26 = 0;
    do {
      PrintFunction(*(Proto **)(*(long *)(pcVar21 + 0x40) + uVar26 * 8),full);
      uVar26 = uVar26 + 1;
      iVar10 = extraout_EAX;
    } while (uVar27 != uVar26);
  }
  return iVar10;
}

Assistant:

static int pmain(lua_State *L) {
    int argc = (int) lua_tointeger(L, 1);
    char **argv = (char **) lua_touserdata(L, 2);
    const Proto *f;
    int i;
    if (!lua_checkstack(L, argc)) fatal("too many input files");
    for (i = 0; i < argc; i++) {
        const char *filename = IS("-") ? NULL : argv[i];
        if (luaL_loadfile(L, filename) != LUA_OK) fatal(lua_tostring(L, -1));
    }
    f = combine(L, argc);
    if (listing) luaU_print(f, listing > 1);
    if (dumping) {
        FILE *D = (output == NULL) ? stdout : fopen(output, "wb");
        if (D == NULL) cannot("open");
        lua_lock(L);
        luaU_dump(L, f, writer, D, stripping);
        lua_unlock(L);
        if (ferror(D)) cannot("write");
        if (fclose(D)) cannot("close");
    }
    return 0;
}